

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmDbcc<(moira::Instr)46,(moira::Mode)12,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  StrWriter *pSVar2;
  UInt u;
  ushort in_CX;
  int *in_RDX;
  StrWriter *in_RSI;
  StrWriter *in_RDI;
  u32 dst;
  Dn src;
  Moira *in_stack_ffffffffffffffc0;
  UInt local_34;
  int local_30;
  int local_2c;
  u32 local_24;
  Dn local_20 [2];
  int *local_18;
  StrWriter *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  Dn::Dn(local_20,in_CX & 7);
  local_24 = *local_18 + 2;
  uVar1 = dasmRead<(moira::Size)2>(in_stack_ffffffffffffffc0,(u32 *)in_RDI);
  local_24 = (int)(short)uVar1 + local_24;
  pSVar2 = StrWriter::operator<<(local_10);
  local_2c = *(int *)(in_RDI->comment + 0x14);
  pSVar2 = StrWriter::operator<<(pSVar2,(Align)local_2c);
  local_30 = local_20[0].raw;
  pSVar2 = StrWriter::operator<<(pSVar2,local_20[0]);
  pSVar2 = StrWriter::operator<<(pSVar2,", ");
  u.raw = (u32)((ulong)pSVar2 >> 0x20);
  UInt::UInt(&local_34,local_24);
  StrWriter::operator<<(in_RDI,u);
  return;
}

Assistant:

void
Moira::dasmDbcc(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Dn ( _____________xxx(op) );
    auto dst = addr + 2;

    dst += (i16)dasmRead<Word>(addr);

    str << Ins<I>{} << tab << src << ", " << UInt(dst);
}